

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_contextual_end(nk_context *ctx)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  nk_vec2 nVar9;
  undefined8 uVar10;
  float fVar11;
  float fVar12;
  nk_rect rect;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x42c3,"void nk_contextual_end(struct nk_context *)");
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x42c4,"void nk_contextual_end(struct nk_context *)");
  }
  if (pnVar4->parent == (nk_window *)0x0) {
    __assert_fail("popup->parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x42c9,"void nk_contextual_end(struct nk_context *)");
  }
  pnVar5 = pnVar4->layout;
  if ((pnVar5->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
      NK_PANEL_NONE) {
    if ((pnVar5->flags & 0x800) != 0) {
      fVar12 = pnVar5->at_y;
      fVar11 = (pnVar5->bounds).y + (pnVar5->bounds).h;
      uVar8 = 0;
      uVar10 = 0;
      if (fVar12 < fVar11) {
        nVar9 = nk_panel_get_padding(&ctx->style,pnVar5->type);
        uVar2 = (pnVar5->bounds).x;
        fVar12 = nVar9.y + fVar12 + pnVar5->footer_height + pnVar5->border + (pnVar5->row).height;
        uVar3 = (pnVar5->bounds).w;
        uVar8 = CONCAT44(fVar12,uVar2);
        uVar10 = CONCAT44(fVar11 - fVar12,uVar3);
      }
      if (((ctx->input).mouse.buttons[0].down == 0) ||
         (bVar6 = true, (ctx->input).mouse.buttons[0].clicked == 0)) {
        bVar6 = false;
      }
      rect.w = (float)(int)uVar10;
      rect.h = (float)(int)((ulong)uVar10 >> 0x20);
      rect.x = (float)(int)uVar8;
      rect.y = (float)(int)((ulong)uVar8 >> 0x20);
      iVar7 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
      if ((bVar6) && (iVar7 != 0)) {
        pbVar1 = (byte *)((long)&pnVar4->flags + 1);
        *pbVar1 = *pbVar1 | 0x20;
      }
    }
    if ((pnVar4->flags & 0x2000) != 0) {
      pnVar4->seq = 0;
    }
    nk_popup_end(ctx);
    return;
  }
  __assert_fail("panel->type & NK_PANEL_SET_POPUP",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x42ca,"void nk_contextual_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_contextual_end(struct nk_context *ctx)
{
    struct nk_window *popup;
    struct nk_panel *panel;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return;

    popup = ctx->current;
    panel = popup->layout;
    NK_ASSERT(popup->parent);
    NK_ASSERT(panel->type & NK_PANEL_SET_POPUP);
    if (panel->flags & NK_WINDOW_DYNAMIC) {
        /* Close behavior
        This is a bit of a hack solution since we do not know before we end our popup
        how big it will be. We therefore do not directly know when a
        click outside the non-blocking popup must close it at that direct frame.
        Instead it will be closed in the next frame.*/
        struct nk_rect body = {0,0,0,0};
        if (panel->at_y < (panel->bounds.y + panel->bounds.h)) {
            struct nk_vec2 padding = nk_panel_get_padding(&ctx->style, panel->type);
            body = panel->bounds;
            body.y = (panel->at_y + panel->footer_height + panel->border + padding.y + panel->row.height);
            body.h = (panel->bounds.y + panel->bounds.h) - body.y;
        }
        {int pressed = nk_input_is_mouse_pressed(&ctx->input, NK_BUTTON_LEFT);
        int in_body = nk_input_is_mouse_hovering_rect(&ctx->input, body);
        if (pressed && in_body)
            popup->flags |= NK_WINDOW_HIDDEN;
        }
    }
    if (popup->flags & NK_WINDOW_HIDDEN)
        popup->seq = 0;
    nk_popup_end(ctx);
    return;
}